

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
CustomUintFormatter<2,true>::
Unser<ParamsStream<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>,unsigned_short>
          (CustomUintFormatter<2,true> *this,
          ParamsStream<ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
          *s,unsigned_short *v)

{
  HashVerifier<AutoFile> *this_00;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint64_t raw;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  this_00 = s->m_substream->m_substream;
  AutoFile::read(this_00->m_source,(int)(uchar *)((long)&local_28 + 6),(void *)0x2,in_RCX);
  CSHA256::Write((CSHA256 *)this_00,(uchar *)((long)&local_28 + 6),2);
  *v = (ushort)(byte)((ulong)local_28 >> 0x38) | (ushort)((ulong)local_28 >> 0x28) & 0xff00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, I& v)
    {
        using U = typename std::conditional<std::is_enum<I>::value, std::underlying_type<I>, std::common_type<I>>::type::type;
        static_assert(std::numeric_limits<U>::max() >= MAX && std::numeric_limits<U>::min() <= 0, "Assigned type too small");
        uint64_t raw = 0;
        if (BigEndian) {
            s.read(AsWritableBytes(Span{&raw, 1}).last(Bytes));
            v = static_cast<I>(be64toh_internal(raw));
        } else {
            s.read(AsWritableBytes(Span{&raw, 1}).first(Bytes));
            v = static_cast<I>(le64toh_internal(raw));
        }
    }